

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_int128_test_case(void)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint64_t uVar5;
  uint64_t lo_1;
  uint64_t hi_1;
  int pos_1;
  int expect_2;
  uint64_t lo;
  uint64_t hi;
  int pos;
  int expect_1;
  uint64_t v1c;
  uint64_t v0c;
  int expect;
  int64_t se;
  int64_t sd;
  uint16_t rst [32];
  uint16_t rse [16];
  uint16_t rsd [16];
  int j_1;
  int uwa_bits;
  int j;
  uint64_t vi;
  int i;
  uint16_t rsc [16];
  uint16_t rsb [16];
  uint16_t ruc [16];
  uint16_t rub [16];
  uint16_t ruwr [32];
  uint16_t ruwz [32];
  uint16_t ruwa [16];
  uint16_t rswr [32];
  uint16_t rswz [32];
  uint16_t rswa [16];
  int64_t sc;
  int64_t sb;
  uint64_t uc;
  uint64_t ub;
  secp256k1_uint128 uwz;
  secp256k1_uint128 uwa;
  secp256k1_int128 swz;
  secp256k1_int128 swa;
  uint64_t v [4];
  uchar buf [32];
  uint in_stack_fffffffffffffc8c;
  undefined4 in_stack_fffffffffffffc90;
  uint in_stack_fffffffffffffc94;
  secp256k1_uint128 *in_stack_fffffffffffffc98;
  secp256k1_uint128 *v_00;
  uint16_t *in_stack_fffffffffffffca0;
  secp256k1_int128 *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  int64_t in_stack_fffffffffffffcb8;
  int64_t in_stack_fffffffffffffcc0;
  long lVar6;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  secp256k1_int128 *in_stack_fffffffffffffcd0;
  ulong hi_00;
  uint64_t local_328;
  uint16_t local_308 [32];
  uint16_t local_2c8 [8];
  uint16_t *in_stack_fffffffffffffd48;
  uint16_t *in_stack_fffffffffffffd50;
  uint16_t *in_stack_fffffffffffffd58;
  uint16_t *in_stack_fffffffffffffd60;
  int local_284;
  int local_280;
  int local_27c;
  uint64_t local_278;
  int local_26c;
  uint16_t local_268 [16];
  uint16_t local_248 [16];
  uint16_t local_228 [16];
  uint16_t local_208 [16];
  secp256k1_uint128 local_1e8 [4];
  undefined1 local_1a8 [64];
  uint16_t local_168 [16];
  uint16_t local_148 [32];
  undefined1 local_108 [64];
  uint16_t local_c8 [16];
  uint64_t local_a8;
  uint64_t local_a0;
  uint64_t local_98;
  uint64_t local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  uint64_t local_48 [4];
  byte local_28 [40];
  
  testrand256_test((uchar *)0x137ee4);
  for (local_26c = 0; local_26c < 4; local_26c = local_26c + 1) {
    local_278 = 0;
    for (local_27c = 0; local_27c < 8; local_27c = local_27c + 1) {
      local_278 = local_278 * 0x100 + (ulong)local_28[local_26c * 8 + local_27c];
    }
    local_48[local_26c] = local_278;
  }
  secp256k1_u128_load((secp256k1_uint128 *)&local_78,local_48[1],local_48[0]);
  secp256k1_i128_load((secp256k1_int128 *)&local_58,local_48[1],local_48[0]);
  local_90 = local_48[2];
  local_a0 = local_48[2];
  local_98 = local_48[3];
  local_a8 = local_48[3];
  load256u128(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  load256i128((uint16_t *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
              in_stack_fffffffffffffca8);
  load256u64(local_208,local_90,0);
  load256u64(local_248,local_a0,1);
  load256u64(local_228,local_98,0);
  load256u64(local_268,local_a8,1);
  mulmod256(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
            in_stack_fffffffffffffd48);
  secp256k1_u128_mul((secp256k1_uint128 *)&local_88,local_90,local_98);
  load256u128(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  iVar2 = secp256k1_memcmp_var(local_1e8,local_1a8,0x10);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x71c,"test condition failed: secp256k1_memcmp_var(ruwr, ruwz, 16) == 0");
    abort();
  }
  v_00 = local_1e8;
  mulmod256(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
            in_stack_fffffffffffffd48);
  add256((uint16_t *)v_00,(uint16_t *)v_00,local_168);
  local_80 = local_70;
  local_88 = local_78;
  secp256k1_u128_accum_mul((secp256k1_uint128 *)&local_88,local_90,local_98);
  load256u128(in_stack_fffffffffffffca0,v_00);
  iVar2 = secp256k1_memcmp_var(local_1e8,local_1a8,0x10);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x723,"test condition failed: secp256k1_memcmp_var(ruwr, ruwz, 16) == 0");
    abort();
  }
  add256((uint16_t *)local_1e8,local_208,local_168);
  local_80 = local_70;
  local_88 = local_78;
  secp256k1_u128_accum_u64((secp256k1_uint128 *)&local_88,local_90);
  load256u128(in_stack_fffffffffffffca0,v_00);
  iVar2 = secp256k1_memcmp_var(local_1e8,local_1a8,0x10);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x729,"test condition failed: secp256k1_memcmp_var(ruwr, ruwz, 16) == 0");
    abort();
  }
  rshift256((uint16_t *)local_1e8,local_168,(uint)local_98 & 0x7f,0);
  local_80 = local_70;
  local_88 = local_78;
  secp256k1_u128_rshift
            ((secp256k1_uint128 *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             in_stack_fffffffffffffc8c);
  load256u128(in_stack_fffffffffffffca0,v_00);
  iVar2 = secp256k1_memcmp_var(local_1e8,local_1a8,0x10);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x72f,"test condition failed: secp256k1_memcmp_var(ruwr, ruwz, 16) == 0");
    abort();
  }
  uVar5 = secp256k1_u128_to_u64((secp256k1_uint128 *)&local_78);
  if (uVar5 != local_48[0]) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x731,"test condition failed: secp256k1_u128_to_u64(&uwa) == v[0]");
    abort();
  }
  uVar5 = secp256k1_u128_hi_u64((secp256k1_uint128 *)&local_78);
  if (uVar5 != local_48[1]) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x733,"test condition failed: secp256k1_u128_hi_u64(&uwa) == v[1]");
    abort();
  }
  secp256k1_u128_from_u64((secp256k1_uint128 *)&local_88,local_90);
  load256u128(in_stack_fffffffffffffca0,v_00);
  iVar2 = secp256k1_memcmp_var(local_208,local_1a8,0x10);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x737,"test condition failed: secp256k1_memcmp_var(rub, ruwz, 16) == 0");
    abort();
  }
  local_280 = 0;
  for (local_284 = 0; local_284 < 0x80; local_284 = local_284 + 1) {
    in_stack_fffffffffffffc94 = (uint)local_168[local_284 / 0x10];
    if ((int)in_stack_fffffffffffffc94 >> ((byte)((long)local_284 % 0x10) & 0x1f) != 0) {
      local_280 = local_284 + 1;
    }
  }
  for (local_284 = 0; local_284 < 0x80; local_284 = local_284 + 1) {
    uVar3 = secp256k1_u128_check_bits
                      ((secp256k1_uint128 *)
                       CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                       in_stack_fffffffffffffc8c);
    if (uVar3 != local_280 <= local_284) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x740,"test condition failed: secp256k1_u128_check_bits(&uwa, j) == (uwa_bits <= j)")
      ;
      abort();
    }
  }
  mulmod256(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
            in_stack_fffffffffffffd48);
  secp256k1_i128_mul((secp256k1_int128 *)&local_68,local_a0,local_a8);
  load256i128((uint16_t *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
              in_stack_fffffffffffffca8);
  iVar2 = secp256k1_memcmp_var(local_148,local_108,0x10);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x747,"test condition failed: secp256k1_memcmp_var(rswr, rswz, 16) == 0");
    abort();
  }
  mulmod256(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
            in_stack_fffffffffffffd48);
  add256(local_148,local_148,local_c8);
  iVar2 = int256is127(local_148);
  if (iVar2 != 0) {
    local_60 = local_50;
    local_68 = local_58;
    secp256k1_i128_accum_mul
              ((secp256k1_int128 *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               (int64_t)in_stack_fffffffffffffca8,(int64_t)in_stack_fffffffffffffca0);
    load256i128((uint16_t *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                in_stack_fffffffffffffca8);
    iVar2 = secp256k1_memcmp_var(local_148,local_108,0x10);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x74f,"test condition failed: secp256k1_memcmp_var(rswr, rswz, 16) == 0");
      abort();
    }
  }
  uVar5 = local_48[1];
  load256u64((uint16_t *)&stack0xfffffffffffffd58,local_48[0],1);
  load256u64(local_2c8,uVar5,1);
  mulmod256(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
            in_stack_fffffffffffffd48);
  neg256(local_308,local_308);
  mulmod256(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
            in_stack_fffffffffffffd48);
  add256(local_148,local_148,local_308);
  secp256k1_i128_det(in_stack_fffffffffffffcd0,
                     CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                     CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  load256i128((uint16_t *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
              in_stack_fffffffffffffca8);
  iVar2 = secp256k1_memcmp_var(local_148,local_108,0x10);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x75d,"test condition failed: secp256k1_memcmp_var(rswr, rswz, 16) == 0");
    abort();
  }
  rshift256(local_148,local_c8,(int)local_98 + (int)(local_98 / 0x7f) * -0x7f,1);
  local_60 = local_50;
  local_68 = local_58;
  secp256k1_i128_rshift
            ((secp256k1_int128 *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             in_stack_fffffffffffffc8c);
  load256i128((uint16_t *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
              in_stack_fffffffffffffca8);
  iVar2 = secp256k1_memcmp_var(local_148,local_108,0x10);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x764,"test condition failed: secp256k1_memcmp_var(rswr, rswz, 16) == 0");
    abort();
  }
  uVar5 = secp256k1_i128_to_u64((secp256k1_int128 *)&local_58);
  if (uVar5 != local_48[0]) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x766,"test condition failed: secp256k1_i128_to_u64(&swa) == v[0]");
    abort();
  }
  secp256k1_i128_from_i64((secp256k1_int128 *)&local_68,local_a0);
  load256i128((uint16_t *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
              in_stack_fffffffffffffca8);
  iVar2 = secp256k1_memcmp_var(local_248,local_108,0x10);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x76a,"test condition failed: secp256k1_memcmp_var(rsb, rswz, 16) == 0");
    abort();
  }
  uVar5 = secp256k1_i128_to_i64
                    ((secp256k1_int128 *)
                     CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  if (uVar5 == local_a0) {
    uVar3 = (uint)local_98 & 1;
    local_60 = local_50;
    local_68 = local_58;
    if ((local_98 & 1) == 0) {
      local_328 = local_48[0];
      if ((local_90 & 0x40) == 0) {
        local_328 = 1L << ((byte)local_90 & 0x3f) ^ local_48[0];
        hi_00 = local_48[1];
      }
      else {
        hi_00 = 1L << ((byte)local_90 & 0x3f) ^ local_48[1];
      }
      secp256k1_i128_load((secp256k1_int128 *)&local_68,hi_00,local_328);
    }
    uVar4 = secp256k1_i128_eq_var((secp256k1_int128 *)&local_58,(secp256k1_int128 *)&local_68);
    if (uVar4 != uVar3) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x77b,"test condition failed: secp256k1_i128_eq_var(&swa, &swz) == expect");
      abort();
    }
    uVar3 = (uint)local_98 & 1;
    uVar4 = (uint)(local_90 % 0x7f);
    bVar1 = (byte)(local_90 % 0x7f);
    if ((local_98 & 1) == 0) {
      if (uVar4 < 0x40) {
        if ((local_48[0] == 1L << (bVar1 & 0x3f)) && (local_48[1] == 0)) {
          uVar3 = 1;
        }
      }
      else if ((local_48[1] == 1L << (bVar1 & 0x3f)) && (local_48[0] == 0)) {
        uVar3 = 1;
      }
      local_60 = local_50;
      local_68 = local_58;
    }
    else {
      lVar6 = 0;
      uVar5 = 0;
      if (uVar4 < 0x40) {
        uVar5 = 1L << (bVar1 & 0x3f);
      }
      else {
        lVar6 = 1L << (bVar1 & 0x3f);
      }
      secp256k1_i128_load((secp256k1_int128 *)&local_68,lVar6,uVar5);
    }
    uVar4 = secp256k1_i128_check_pow2
                      ((secp256k1_int128 *)in_stack_fffffffffffffca0,(uint)((ulong)v_00 >> 0x20),
                       (int)v_00);
    if (uVar4 == uVar3) {
      uVar3 = (uint)local_98 & 1;
      uVar4 = (uint)(local_90 % 0x7f);
      bVar1 = (byte)(local_90 % 0x7f);
      if ((local_98 & 1) == 0) {
        if (uVar4 < 0x40) {
          if ((local_48[0] == -1L << (bVar1 & 0x3f)) && (local_48[1] == 0xffffffffffffffff)) {
            uVar3 = 1;
          }
        }
        else if ((local_48[1] == -1L << (bVar1 & 0x3f)) && (local_48[0] == 0)) {
          uVar3 = 1;
        }
        local_60 = local_50;
        local_68 = local_58;
      }
      else {
        lVar6 = -1;
        if (uVar4 < 0x40) {
          in_stack_fffffffffffffca0 = (uint16_t *)(-1L << (bVar1 & 0x3f));
        }
        else {
          lVar6 = -1L << (bVar1 & 0x3f);
          in_stack_fffffffffffffca0 = (uint16_t *)0x0;
        }
        secp256k1_i128_load((secp256k1_int128 *)&local_68,lVar6,(uint64_t)in_stack_fffffffffffffca0)
        ;
      }
      uVar4 = secp256k1_i128_check_pow2
                        ((secp256k1_int128 *)in_stack_fffffffffffffca0,(uint)((ulong)v_00 >> 0x20),
                         (int)v_00);
      if (uVar4 == uVar3) {
        return;
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x7ae,"test condition failed: secp256k1_i128_check_pow2(&swz, pos, -1) == expect");
      abort();
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x794,"test condition failed: secp256k1_i128_check_pow2(&swz, pos, 1) == expect");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x76c,"test condition failed: secp256k1_i128_to_i64(&swz) == sb");
  abort();
}

Assistant:

static void run_int128_test_case(void) {
    unsigned char buf[32];
    uint64_t v[4];
    secp256k1_int128 swa, swz;
    secp256k1_uint128 uwa, uwz;
    uint64_t ub, uc;
    int64_t sb, sc;
    uint16_t rswa[16], rswz[32], rswr[32], ruwa[16], ruwz[32], ruwr[32];
    uint16_t rub[16], ruc[16], rsb[16], rsc[16];
    int i;

    /* Generate 32-byte random value. */
    testrand256_test(buf);
    /* Convert into 4 64-bit integers. */
    for (i = 0; i < 4; ++i) {
        uint64_t vi = 0;
        int j;
        for (j = 0; j < 8; ++j) vi = (vi << 8) + buf[8*i + j];
        v[i] = vi;
    }
    /* Convert those into a 128-bit value and two 64-bit values (signed and unsigned). */
    secp256k1_u128_load(&uwa, v[1], v[0]);
    secp256k1_i128_load(&swa, v[1], v[0]);
    ub = v[2];
    sb = v[2];
    uc = v[3];
    sc = v[3];
    /* Load those also into 16-bit array representations. */
    load256u128(ruwa, &uwa);
    load256i128(rswa, &swa);
    load256u64(rub, ub, 0);
    load256u64(rsb, sb, 1);
    load256u64(ruc, uc, 0);
    load256u64(rsc, sc, 1);
    /* test secp256k1_u128_mul */
    mulmod256(ruwr, rub, ruc, NULL);
    secp256k1_u128_mul(&uwz, ub, uc);
    load256u128(ruwz, &uwz);
    CHECK(secp256k1_memcmp_var(ruwr, ruwz, 16) == 0);
    /* test secp256k1_u128_accum_mul */
    mulmod256(ruwr, rub, ruc, NULL);
    add256(ruwr, ruwr, ruwa);
    uwz = uwa;
    secp256k1_u128_accum_mul(&uwz, ub, uc);
    load256u128(ruwz, &uwz);
    CHECK(secp256k1_memcmp_var(ruwr, ruwz, 16) == 0);
    /* test secp256k1_u128_accum_u64 */
    add256(ruwr, rub, ruwa);
    uwz = uwa;
    secp256k1_u128_accum_u64(&uwz, ub);
    load256u128(ruwz, &uwz);
    CHECK(secp256k1_memcmp_var(ruwr, ruwz, 16) == 0);
    /* test secp256k1_u128_rshift */
    rshift256(ruwr, ruwa, uc % 128, 0);
    uwz = uwa;
    secp256k1_u128_rshift(&uwz, uc % 128);
    load256u128(ruwz, &uwz);
    CHECK(secp256k1_memcmp_var(ruwr, ruwz, 16) == 0);
    /* test secp256k1_u128_to_u64 */
    CHECK(secp256k1_u128_to_u64(&uwa) == v[0]);
    /* test secp256k1_u128_hi_u64 */
    CHECK(secp256k1_u128_hi_u64(&uwa) == v[1]);
    /* test secp256k1_u128_from_u64 */
    secp256k1_u128_from_u64(&uwz, ub);
    load256u128(ruwz, &uwz);
    CHECK(secp256k1_memcmp_var(rub, ruwz, 16) == 0);
    /* test secp256k1_u128_check_bits */
    {
        int uwa_bits = 0;
        int j;
        for (j = 0; j < 128; ++j) {
            if (ruwa[j / 16] >> (j % 16)) uwa_bits = 1 + j;
        }
        for (j = 0; j < 128; ++j) {
            CHECK(secp256k1_u128_check_bits(&uwa, j) == (uwa_bits <= j));
        }
    }
    /* test secp256k1_i128_mul */
    mulmod256(rswr, rsb, rsc, NULL);
    secp256k1_i128_mul(&swz, sb, sc);
    load256i128(rswz, &swz);
    CHECK(secp256k1_memcmp_var(rswr, rswz, 16) == 0);
    /* test secp256k1_i128_accum_mul */
    mulmod256(rswr, rsb, rsc, NULL);
    add256(rswr, rswr, rswa);
    if (int256is127(rswr)) {
        swz = swa;
        secp256k1_i128_accum_mul(&swz, sb, sc);
        load256i128(rswz, &swz);
        CHECK(secp256k1_memcmp_var(rswr, rswz, 16) == 0);
    }
    /* test secp256k1_i128_det */
    {
        uint16_t rsd[16], rse[16], rst[32];
        int64_t sd = v[0], se = v[1];
        load256u64(rsd, sd, 1);
        load256u64(rse, se, 1);
        mulmod256(rst, rsc, rsd, NULL);
        neg256(rst, rst);
        mulmod256(rswr, rsb, rse, NULL);
        add256(rswr, rswr, rst);
        secp256k1_i128_det(&swz, sb, sc, sd, se);
        load256i128(rswz, &swz);
        CHECK(secp256k1_memcmp_var(rswr, rswz, 16) == 0);
    }
    /* test secp256k1_i128_rshift */
    rshift256(rswr, rswa, uc % 127, 1);
    swz = swa;
    secp256k1_i128_rshift(&swz, uc % 127);
    load256i128(rswz, &swz);
    CHECK(secp256k1_memcmp_var(rswr, rswz, 16) == 0);
    /* test secp256k1_i128_to_u64 */
    CHECK(secp256k1_i128_to_u64(&swa) == v[0]);
    /* test secp256k1_i128_from_i64 */
    secp256k1_i128_from_i64(&swz, sb);
    load256i128(rswz, &swz);
    CHECK(secp256k1_memcmp_var(rsb, rswz, 16) == 0);
    /* test secp256k1_i128_to_i64 */
    CHECK(secp256k1_i128_to_i64(&swz) == sb);
    /* test secp256k1_i128_eq_var */
    {
        int expect = (uc & 1);
        swz = swa;
        if (!expect) {
            /* Make sure swz != swa */
            uint64_t v0c = v[0], v1c = v[1];
            if (ub & 64) {
                v1c ^= (((uint64_t)1) << (ub & 63));
            } else {
                v0c ^= (((uint64_t)1) << (ub & 63));
            }
            secp256k1_i128_load(&swz, v1c, v0c);
        }
        CHECK(secp256k1_i128_eq_var(&swa, &swz) == expect);
    }
    /* test secp256k1_i128_check_pow2 (sign == 1) */
    {
        int expect = (uc & 1);
        int pos = ub % 127;
        if (expect) {
            /* If expect==1, set swz to exactly 2^pos. */
            uint64_t hi = 0;
            uint64_t lo = 0;
            if (pos >= 64) {
                hi = (((uint64_t)1) << (pos & 63));
            } else {
                lo = (((uint64_t)1) << (pos & 63));
            }
            secp256k1_i128_load(&swz, hi, lo);
        } else {
            /* If expect==0, set swz = swa, but update expect=1 if swa happens to equal 2^pos. */
            if (pos >= 64) {
                if ((v[1] == (((uint64_t)1) << (pos & 63))) && v[0] == 0) expect = 1;
            } else {
                if ((v[0] == (((uint64_t)1) << (pos & 63))) && v[1] == 0) expect = 1;
            }
            swz = swa;
        }
        CHECK(secp256k1_i128_check_pow2(&swz, pos, 1) == expect);
    }
    /* test secp256k1_i128_check_pow2 (sign == -1) */
    {
        int expect = (uc & 1);
        int pos = ub % 127;
        if (expect) {
            /* If expect==1, set swz to exactly -2^pos. */
            uint64_t hi = ~(uint64_t)0;
            uint64_t lo = ~(uint64_t)0;
            if (pos >= 64) {
                hi <<= (pos & 63);
                lo = 0;
            } else {
                lo <<= (pos & 63);
            }
            secp256k1_i128_load(&swz, hi, lo);
        } else {
            /* If expect==0, set swz = swa, but update expect=1 if swa happens to equal -2^pos. */
            if (pos >= 64) {
                if ((v[1] == ((~(uint64_t)0) << (pos & 63))) && v[0] == 0) expect = 1;
            } else {
                if ((v[0] == ((~(uint64_t)0) << (pos & 63))) && v[1] == ~(uint64_t)0) expect = 1;
            }
            swz = swa;
        }
        CHECK(secp256k1_i128_check_pow2(&swz, pos, -1) == expect);
    }
}